

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pcache1EnforceMaxPage(PGroup *pGroup)

{
  PgHdr1 *pPage;
  PgHdr1 *p;
  
  while ((pGroup->nMaxPage < pGroup->nCurrentPage &&
         (pPage = pGroup->pLruTail, pPage != (PgHdr1 *)0x0))) {
    pcache1PinPage(pPage);
    pcache1RemoveFromHash(pPage);
    pcache1FreePage(pPage);
  }
  return;
}

Assistant:

static void pcache1EnforceMaxPage(PGroup *pGroup){
  assert( sqlite3_mutex_held(pGroup->mutex) );
  while( pGroup->nCurrentPage>pGroup->nMaxPage && pGroup->pLruTail ){
    PgHdr1 *p = pGroup->pLruTail;
    assert( p->pCache->pGroup==pGroup );
    assert( p->isPinned==0 );
    pcache1PinPage(p);
    pcache1RemoveFromHash(p);
    pcache1FreePage(p);
  }
}